

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O1

DecoratorDataHandle __thiscall
Rml::DecoratorTiledVertical::GenerateElementData
          (DecoratorTiledVertical *this,Element *element,BoxArea paint_area)

{
  undefined1 *this_00;
  undefined1 *this_01;
  Geometry *pGVar1;
  void *pvVar2;
  Vector2f surface_origin;
  Vector2f surface_origin_00;
  Vector2f surface_dimensions;
  Element *element_00;
  undefined8 uVar3;
  undefined4 uVar4;
  uint num_textures;
  ComputedValues *computed;
  DecoratorTiledVerticalData *this_02;
  RenderManager *mesh_00;
  long lVar5;
  float fVar6;
  float minimum_height;
  float fVar7;
  Texture texture;
  Vector2f bottom_dimensions;
  Vector2f top_dimensions;
  Vector2f centre_dimensions;
  Mesh mesh [3];
  RenderBox render_box;
  float local_178;
  float fStack_174;
  Vector2f local_168;
  Element *local_160;
  Vector2f local_158;
  Vector2f local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  Tile *apTStack_128 [2];
  _Bit_iterator_base local_118;
  Vector2f local_108;
  __uniq_ptr_impl<Rml::TextureDatabase,_std::default_delete<Rml::TextureDatabase>_> _Stack_100;
  Mesh local_f8 [3];
  RenderBox local_60;
  
  lVar5 = 0x30;
  local_160 = element;
  do {
    texture = Decorator::GetTexture
                        ((Decorator *)this,
                         *(int *)((long)&(this->super_DecoratorTiled).super_Decorator.
                                         _vptr_Decorator + lVar5));
    DecoratorTiled::Tile::CalculateDimensions
              ((Tile *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5)
               ,texture);
    element_00 = local_160;
    lVar5 = lVar5 + 0x4c;
  } while (lVar5 != 0x114);
  Element::GetRenderBox(&local_60,local_160,paint_area,0);
  local_138 = ZEXT416((uint)local_60.border_widths._M_elems[3]);
  local_118 = (_Bit_iterator_base)ZEXT416((uint)local_60.border_widths._M_elems[0]);
  local_108.y = local_60.border_widths._M_elems[0];
  local_108.x = local_60.border_widths._M_elems[3];
  _Stack_100._M_t.
  super__Tuple_impl<0UL,_Rml::TextureDatabase_*,_std::default_delete<Rml::TextureDatabase>_>.
  super__Head_base<0UL,_Rml::TextureDatabase_*,_false>._M_head_impl =
       (tuple<Rml::TextureDatabase_*,_std::default_delete<Rml::TextureDatabase>_>)
       (_Tuple_impl<0UL,_Rml::TextureDatabase_*,_std::default_delete<Rml::TextureDatabase>_>)0x0;
  this_00 = &this->field_0x30;
  local_158 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_00,element_00);
  apTStack_128[1] = (Tile *)&this->field_0x7c;
  local_168 = DecoratorTiled::Tile::GetNaturalDimensions(apTStack_128[1],element_00);
  this_01 = &this->field_0xc8;
  local_150 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_01,element_00);
  local_178 = local_60.fill_size.x;
  DecoratorTiled::ScaleTileDimensions(&this->super_DecoratorTiled,&local_158,local_178,Horizontal);
  DecoratorTiled::ScaleTileDimensions(&this->super_DecoratorTiled,&local_168,local_178,Horizontal);
  DecoratorTiled::ScaleTileDimensions(&this->super_DecoratorTiled,&local_150,local_178,Horizontal);
  fVar6 = Math::Round(local_158.y);
  local_158.y = fVar6;
  fVar6 = Math::Round(local_168.y);
  fStack_174 = local_60.fill_size.y;
  fVar7 = fVar6 + local_158.y;
  if (fStack_174 < fVar7) {
    local_158.y = (local_158.y / fVar7) * fStack_174;
    fVar6 = (fVar6 / fVar7) * fStack_174;
  }
  local_168.y = fVar6;
  computed = Element::GetComputedValues(local_160);
  memset(local_f8,0,0x90);
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_00,local_f8 + *(int *)this_00,computed,local_108,local_158,local_158);
  local_138._0_4_ = (float)local_138._0_4_ + 0.0;
  surface_origin.y = local_118._M_p._0_4_ + local_158.y;
  surface_origin.x = (float)local_138._0_4_;
  surface_dimensions.y = fStack_174 - (local_158.y + local_168.y);
  surface_dimensions.x = local_150.x;
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_01,local_f8 + *(int *)this_01,computed,surface_origin,surface_dimensions,
             local_150);
  surface_origin_00.y = local_118._M_p._0_4_ + (fStack_174 - local_168.y);
  surface_origin_00.x = (float)local_138._0_4_;
  DecoratorTiled::Tile::GenerateGeometry
            (apTStack_128[1],local_f8 + apTStack_128[1]->texture_index,computed,surface_origin_00,
             local_168,local_168);
  num_textures = Decorator::GetNumTextures((Decorator *)this);
  this_02 = (DecoratorTiledVerticalData *)operator_new(0x10);
  DecoratorTiledVerticalData::DecoratorTiledVerticalData(this_02,num_textures);
  mesh_00 = Element::GetRenderManager(local_160);
  if (0 < (int)num_textures) {
    lVar5 = 0;
    do {
      RenderManager::MakeGeometry((RenderManager *)local_148,(Mesh *)mesh_00);
      pGVar1 = this_02->geometry;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)((long)&(pGVar1->
                                    super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                    ).render_manager + lVar5));
      uVar4 = local_148._8_4_;
      uVar3 = local_148._0_8_;
      local_148._0_8_ = (RenderInterface *)0x0;
      *(undefined8 *)
       ((long)&(pGVar1->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).render_manager + lVar5) = uVar3;
      local_148._8_4_ = 0xffffffff;
      *(undefined4 *)
       ((long)&(pGVar1->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).resource_handle + lVar5) = uVar4;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)local_148);
      lVar5 = lVar5 + 0x10;
    } while ((ulong)num_textures << 4 != lVar5);
  }
  lVar5 = 0x90;
  do {
    pvVar2 = *(void **)((long)&local_118._M_offset + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)local_f8 + lVar5 + -8) - (long)pvVar2);
    }
    pvVar2 = *(void **)((long)apTStack_128 + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&local_118._M_p + lVar5) - (long)pvVar2);
    }
    lVar5 = lVar5 + -0x30;
  } while (lVar5 != 0);
  return (DecoratorDataHandle)this_02;
}

Assistant:

DecoratorDataHandle DecoratorTiledVertical::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tile for this element.
	for (int i = 0; i < 3; i++)
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector2f top_dimensions = tiles[TOP].GetNaturalDimensions(element);
	Vector2f bottom_dimensions = tiles[BOTTOM].GetNaturalDimensions(element);
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);

	// Scale the tile sizes by the width scale.
	ScaleTileDimensions(top_dimensions, size.x, Axis::Horizontal);
	ScaleTileDimensions(bottom_dimensions, size.x, Axis::Horizontal);
	ScaleTileDimensions(centre_dimensions, size.x, Axis::Horizontal);

	// Round the outer tile heights now so that we don't get gaps when rounding again in GenerateGeometry.
	top_dimensions.y = Math::Round(top_dimensions.y);
	bottom_dimensions.y = Math::Round(bottom_dimensions.y);

	// Shrink the y-sizes on the left and right tiles if necessary.
	if (size.y < top_dimensions.y + bottom_dimensions.y)
	{
		float minimum_height = top_dimensions.y + bottom_dimensions.y;
		top_dimensions.y = size.y * (top_dimensions.y / minimum_height);
		bottom_dimensions.y = size.y * (bottom_dimensions.y / minimum_height);
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	tiles[TOP].GenerateGeometry(mesh[tiles[TOP].texture_index], computed, offset, top_dimensions, top_dimensions);

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(0, top_dimensions.y),
		Vector2f(centre_dimensions.x, size.y - (top_dimensions.y + bottom_dimensions.y)), centre_dimensions);

	tiles[BOTTOM].GenerateGeometry(mesh[tiles[BOTTOM].texture_index], computed, offset + Vector2f(0, size.y - bottom_dimensions.y), bottom_dimensions,
		bottom_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledVerticalData* data = new DecoratorTiledVerticalData(num_textures);

	// Set the mesh and textures on the geometry.
	RenderManager* render_manager = element->GetRenderManager();
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}